

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O0

double getQuadraticObjective(Quadratic *idata)

{
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double rtr;
  double quadratic;
  
  dVar1 = vectorProduct((vector<double,_std::allocator<double>_> *)rtr,in_RDI);
  dVar2 = vectorProduct((vector<double,_std::allocator<double>_> *)rtr,in_RDI);
  dVar3 = vectorProduct((vector<double,_std::allocator<double>_> *)rtr,in_RDI);
  return dVar3 / ((double)in_RDI[0x33].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start * 2.0) + dVar2 + dVar1;
}

Assistant:

double getQuadraticObjective(const Quadratic& idata) {
  // c'x
  double quadratic = vectorProduct(idata.lp.col_cost_, idata.xk.col_value);

  // lambda'x
  quadratic += vectorProduct(idata.lambda, idata.residual);

  // 1/2mu r'r
  double rtr = vectorProduct(idata.residual, idata.lambda);
  quadratic += rtr / (2 * idata.mu);

  return quadratic;
}